

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

bool __thiscall S1Interval::ApproxEquals(S1Interval *this,S1Interval *y,double max_error)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  undefined1 local_31;
  double max_error_local;
  S1Interval *y_local;
  S1Interval *this_local;
  
  bVar3 = is_empty(this);
  if (bVar3) {
    dVar1 = GetLength(y);
    this_local._7_1_ = dVar1 <= max_error * 2.0;
  }
  else {
    bVar3 = is_empty(y);
    if (bVar3) {
      dVar1 = GetLength(this);
      this_local._7_1_ = dVar1 <= max_error * 2.0;
    }
    else {
      bVar3 = is_full(this);
      if (bVar3) {
        dVar1 = GetLength(y);
        this_local._7_1_ = (3.141592653589793 - max_error) * 2.0 <= dVar1;
      }
      else {
        bVar3 = is_full(y);
        if (bVar3) {
          dVar1 = GetLength(this);
          this_local._7_1_ = (3.141592653589793 - max_error) * 2.0 <= dVar1;
        }
        else {
          dVar1 = lo(y);
          dVar2 = lo(this);
          dVar1 = remainder(dVar1 - dVar2,6.283185307179586);
          local_31 = false;
          if (ABS(dVar1) <= max_error) {
            dVar1 = hi(y);
            dVar2 = hi(this);
            dVar1 = remainder(dVar1 - dVar2,6.283185307179586);
            local_31 = false;
            if (ABS(dVar1) <= max_error) {
              dVar1 = GetLength(this);
              dVar2 = GetLength(y);
              local_31 = ABS(dVar1 - dVar2) <= max_error * 2.0;
            }
          }
          this_local._7_1_ = local_31;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S1Interval::ApproxEquals(const S1Interval& y, double max_error) const {
  // Full and empty intervals require special cases because the "endpoints"
  // are considered to be positioned arbitrarily.
  if (is_empty()) return y.GetLength() <= 2 * max_error;
  if (y.is_empty()) return GetLength() <= 2 * max_error;
  if (is_full()) return y.GetLength() >= 2 * (M_PI - max_error);
  if (y.is_full()) return GetLength() >= 2 * (M_PI - max_error);

  // The purpose of the last test below is to verify that moving the endpoints
  // does not invert the interval, e.g. [-1e20, 1e20] vs. [1e20, -1e20].
  return (fabs(remainder(y.lo() - lo(), 2 * M_PI)) <= max_error &&
          fabs(remainder(y.hi() - hi(), 2 * M_PI)) <= max_error &&
          fabs(GetLength() - y.GetLength()) <= 2 * max_error);
}